

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom JS_NewAtomLen(JSContext *ctx,char *str,size_t len)

{
  JSAtom JVar1;
  int in_ECX;
  JSValue JVar2;
  
  if (((len == 0) || ((byte)*str - 0x3a < 0xfffffff6)) &&
     (JVar1 = __JS_FindAtom(ctx->rt,str,len,in_ECX), JVar1 != 0)) {
    return JVar1;
  }
  JVar2 = JS_NewStringLen(ctx,str,len);
  if ((int)JVar2.tag == 6) {
    return 0;
  }
  JVar1 = JS_NewAtomStr(ctx,(JSString *)JVar2.u.ptr);
  return JVar1;
}

Assistant:

JSAtom JS_NewAtomLen(JSContext *ctx, const char *str, size_t len)
{
    JSValue val;

    if (len == 0 || !is_digit(*str)) {
        JSAtom atom = __JS_FindAtom(ctx->rt, str, len, JS_ATOM_TYPE_STRING);
        if (atom)
            return atom;
    }
    val = JS_NewStringLen(ctx, str, len);
    if (JS_IsException(val))
        return JS_ATOM_NULL;
    return JS_NewAtomStr(ctx, JS_VALUE_GET_STRING(val));
}